

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

pair<char,_int> *
eastl::copy_backward_chooser<eastl::pair<char,int>*,eastl::pair<char,int>*>
          (pair<char,_int> *first,pair<char,_int> *last,pair<char,_int> *result)

{
  pair<char,_int> *ppVar1;
  bool bHasTrivialCopy;
  pair<char,_int> *result_local;
  pair<char,_int> *last_local;
  pair<char,_int> *first_local;
  
  ppVar1 = copy_backward_impl<false,std::random_access_iterator_tag>::
           do_copy<eastl::pair<char,int>*,eastl::pair<char,int>*>(first,last,result);
  return ppVar1;
}

Assistant:

inline OutputIterator
    copy_backward_chooser(InputIterator first, InputIterator last, OutputIterator result)
    {
        typedef typename eastl::iterator_traits<InputIterator>::iterator_category IC;
        typedef typename eastl::iterator_traits<InputIterator>::value_type        value_type_input;
        typedef typename eastl::iterator_traits<OutputIterator>::value_type       value_type_output;

        const bool bHasTrivialCopy = type_and<has_trivial_assign<value_type_input>::value, 
                                              is_pointer<InputIterator>::value,
                                              is_pointer<OutputIterator>::value,
                                              is_same<value_type_input, value_type_output>::value>::value;

        return eastl::copy_backward_impl<bHasTrivialCopy, IC>::do_copy(first, last, result);
    }